

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

void __thiscall
CCoinsViewCache::CCoinsViewCache(CCoinsViewCache *this,CCoinsView *baseIn,bool deterministic)

{
  uint256 *puVar1;
  uchar *puVar2;
  base_blob<256U> *pbVar3;
  long in_FS_OFFSET;
  allocator_type local_48;
  key_equal local_39;
  SaltedOutpointHasher local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_CCoinsViewBacked).base = baseIn;
  (this->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_006bff28;
  this->m_deterministic = deterministic;
  puVar1 = &this->hashBlock;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &(this->hashBlock).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  pbVar3 = &(this->hashBlock).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &(this->hashBlock).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  PoolResource<144UL,_8UL>::PoolResource(&this->m_cache_coins_memory_resource,0x40000);
  puVar2 = (uchar *)((long)(this->m_sentinel).first.hash.m_wrapped.super_base_blob<256U>.m_data.
                           _M_elems + 0x10);
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  puVar2 = (uchar *)((long)(this->m_sentinel).first.hash.m_wrapped.super_base_blob<256U>.m_data.
                           _M_elems + 0x18);
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  puVar1 = &(this->m_sentinel).first.hash.m_wrapped;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  puVar2 = (uchar *)((long)(this->m_sentinel).first.hash.m_wrapped.super_base_blob<256U>.m_data.
                           _M_elems + 8);
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  (this->m_sentinel).first.n = 0xffffffff;
  (this->m_sentinel).second.m_prev = (CoinsCachePair *)0x0;
  (this->m_sentinel).second.m_next = (CoinsCachePair *)0x0;
  *(undefined8 *)&(this->m_sentinel).second.m_flags = 0;
  (this->m_sentinel).second.coin.out.nValue = 0;
  (this->m_sentinel).second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
  indirect = (char *)0x0;
  *(undefined8 *)
   ((long)&(this->m_sentinel).second.coin.out.scriptPubKey.super_CScriptBase._union + 8) = 0;
  *(undefined8 *)
   ((long)&(this->m_sentinel).second.coin.out.scriptPubKey.super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)
   ((long)&(this->m_sentinel).second.coin.out.scriptPubKey.super_CScriptBase._union + 0x18) = 0;
  *(undefined8 *)&(this->m_sentinel).second.coin.field_0x28 = 0;
  CCoinsCacheEntry::CCoinsCacheEntry(&(this->m_sentinel).second);
  SaltedOutpointHasher::SaltedOutpointHasher(&local_38,deterministic);
  local_48.m_resource = &this->m_cache_coins_memory_resource;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->cacheCoins)._M_h,0,&local_38,&local_39,&local_48);
  this->cachedCoinsUsage = 0;
  (this->m_sentinel).second.m_prev = &this->m_sentinel;
  (this->m_sentinel).second.m_next = &this->m_sentinel;
  (this->m_sentinel).second.m_flags = '\x01';
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CCoinsViewCache::CCoinsViewCache(CCoinsView* baseIn, bool deterministic) :
    CCoinsViewBacked(baseIn), m_deterministic(deterministic),
    cacheCoins(0, SaltedOutpointHasher(/*deterministic=*/deterministic), CCoinsMap::key_equal{}, &m_cache_coins_memory_resource)
{
    m_sentinel.second.SelfRef(m_sentinel);
}